

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionJITTimeInfo.cpp
# Opt level: O1

FunctionJITTimeInfo * __thiscall
FunctionJITTimeInfo::GetInlinee(FunctionJITTimeInfo *this,ProfileId profileId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionJITTimeDataIDL *pFVar4;
  undefined6 in_register_00000032;
  
  if (((this->m_data).bodyData)->profiledCallSiteCount <= profileId) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                       ,0x19e,"(profileId < m_data.bodyData->profiledCallSiteCount)",
                       "profileId < m_data.bodyData->profiledCallSiteCount");
    if (!bVar2) goto LAB_0043c37a;
    *puVar3 = 0;
  }
  if ((this->m_data).inlinees == (FunctionJITTimeDataIDL **)0x0) {
    pFVar4 = (FunctionJITTimeDataIDL *)0x0;
  }
  else {
    if ((this->m_data).inlineeCount <= (uint)CONCAT62(in_register_00000032,profileId)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                         ,0x1a3,"(profileId < m_data.inlineeCount)",
                         "profileId < m_data.inlineeCount");
      if (!bVar2) {
LAB_0043c37a:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    pFVar4 = (this->m_data).inlinees[profileId];
    if ((pFVar4 == (FunctionJITTimeDataIDL *)0x0) &&
       (pFVar4 = (FunctionJITTimeDataIDL *)0x0,
       (this->m_data).inlineesRecursionFlags[profileId] != '\0')) {
      pFVar4 = &this->m_data;
    }
  }
  return (FunctionJITTimeInfo *)pFVar4;
}

Assistant:

const FunctionJITTimeInfo *
FunctionJITTimeInfo::GetInlinee(Js::ProfileId profileId) const
{
    Assert(profileId < m_data.bodyData->profiledCallSiteCount);
    if (!m_data.inlinees)
    {
        return nullptr;
    }
    AssertOrFailFast(profileId < m_data.inlineeCount);

    auto inlinee = reinterpret_cast<const FunctionJITTimeInfo *>(m_data.inlinees[profileId]);
    if (inlinee == nullptr && m_data.inlineesRecursionFlags[profileId])
    {
        inlinee = this;
    }
    return inlinee;
}